

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

stbi_uc * bmp_load(stbi *s,int *x,int *y,int *comp,int req_comp)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  uint32 uVar5;
  uint32 uVar6;
  int iVar7;
  uint32 uVar8;
  uint32 uVar9;
  int iVar10;
  uint32 uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uchar *data;
  uint x_00;
  long lVar17;
  uchar uVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  bool bVar27;
  stbi_uc pal [256] [4];
  uint local_4ac;
  uint local_4a8;
  int local_48c;
  int local_488;
  int local_484;
  uchar auStack_438 [1032];
  
  iVar4 = get8(s);
  if ((iVar4 != 0x42) || (iVar4 = get8(s), iVar4 != 0x4d)) goto LAB_001c3c29;
  get32le(s);
  get8(s);
  get8(s);
  get8(s);
  get8(s);
  uVar5 = get32le(s);
  uVar6 = get32le(s);
  if (((0x38 < uVar6) || ((0x100010000001000U >> ((ulong)uVar6 & 0x3f) & 1) == 0)) &&
     (uVar6 != 0x6c)) {
    failure_reason = "BMP type not supported: unknown";
    return (stbi_uc *)0x0;
  }
  failure_reason = "bad BMP";
  if (uVar6 == 0xc) {
    iVar4 = get8(s);
    iVar7 = get8(s);
    s->img_x = iVar7 * 0x100 + iVar4;
    iVar4 = get8(s);
    iVar7 = get8(s);
    uVar8 = iVar7 * 0x100 + iVar4;
  }
  else {
    uVar8 = get32le(s);
    s->img_x = uVar8;
    uVar8 = get32le(s);
  }
  s->img_y = uVar8;
  iVar4 = get8(s);
  iVar7 = get8(s);
  if (iVar7 * 0x100 + iVar4 != 1) {
    return (stbi_uc *)0x0;
  }
  iVar7 = get8(s);
  iVar4 = get8(s);
  iVar7 = iVar4 * 0x100 + iVar7;
  if (iVar7 == 1) {
    failure_reason = "BMP type not supported: 1-bit";
    return (stbi_uc *)0x0;
  }
  uVar8 = s->img_y;
  uVar11 = -uVar8;
  if (0 < (int)uVar8) {
    uVar11 = uVar8;
  }
  s->img_y = uVar11;
  if (uVar6 == 0xc) {
    uVar11 = 0;
    if (iVar7 < 0x18) {
      uVar14 = (int)(uVar5 - 0x26) / 3;
    }
    else {
      uVar14 = 0;
    }
    local_4a8 = 0;
    local_4ac = 0;
    uVar23 = 0;
  }
  else {
    uVar9 = get32le(s);
    if (uVar9 - 1 < 2) {
      failure_reason = "BMP type not supported: RLE";
      return (stbi_uc *)0x0;
    }
    get32le(s);
    get32le(s);
    get32le(s);
    get32le(s);
    get32le(s);
    if (uVar6 == 0x28) {
LAB_001c36e4:
      if (iVar7 != 0x20) {
        uVar11 = 0;
        local_4a8 = 0;
        local_4ac = 0;
        uVar23 = 0;
        if (iVar7 != 0x10) goto LAB_001c3877;
      }
      if (uVar9 == 3) {
        uVar23 = get32le(s);
        local_4ac = get32le(s);
        local_4a8 = get32le(s);
        if (local_4ac == local_4a8 && uVar23 == local_4ac) {
          return (stbi_uc *)0x0;
        }
      }
      else {
        if (uVar9 != 0) {
          return (stbi_uc *)0x0;
        }
        bVar27 = iVar7 == 0x20;
        local_4a8 = 0x1f;
        if (bVar27) {
          local_4a8 = 0xff;
        }
        local_4ac = 0x3e0;
        if (bVar27) {
          local_4ac = 0xff00;
        }
        uVar23 = 0x7c00;
        if (bVar27) {
          uVar23 = 0xff0000;
        }
      }
      uVar14 = 0;
      uVar11 = 0;
    }
    else {
      if (uVar6 != 0x6c) {
        if (uVar6 != 0x38) {
          __assert_fail("hsz == 108",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/meruiden[P]CS3D/external/soil/src/stb_image_aug.c"
                        ,0xa15,"stbi_uc *bmp_load(stbi *, int *, int *, int *, int)");
        }
        get32le(s);
        get32le(s);
        get32le(s);
        get32le(s);
        goto LAB_001c36e4;
      }
      uVar23 = get32le(s);
      local_4ac = get32le(s);
      local_4a8 = get32le(s);
      uVar11 = get32le(s);
      get32le(s);
      iVar4 = 0xc;
      do {
        get32le(s);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
LAB_001c3877:
      uVar14 = 0;
      if (iVar7 < 0x10) {
        uVar14 = (int)((uVar5 - uVar6) + -0xe) >> 2;
      }
    }
  }
  iVar4 = 4 - (uint)(uVar11 == 0);
  s->img_n = iVar4;
  if (2 < req_comp) {
    iVar4 = req_comp;
  }
  data = (uchar *)malloc((ulong)(s->img_x * iVar4 * s->img_y));
  if (data == (uchar *)0x0) {
    failure_reason = "Out of memory";
    return (stbi_uc *)0x0;
  }
  if (iVar7 < 0x10) {
    if ((int)uVar14 < 0x101 && uVar14 != 0) {
      if (0 < (int)uVar14) {
        uVar21 = 0;
        do {
          iVar10 = get8(s);
          auStack_438[uVar21 * 4 + 2] = (uchar)iVar10;
          iVar10 = get8(s);
          auStack_438[uVar21 * 4 + 1] = (uchar)iVar10;
          iVar10 = get8(s);
          auStack_438[uVar21 * 4] = (uchar)iVar10;
          if (uVar6 != 0xc) {
            get8(s);
          }
          auStack_438[uVar21 * 4 + 3] = 0xff;
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
      }
      iVar10 = (uVar5 - uVar6) + uVar14 * (uVar6 == 0xc | 0xfffffffc) + -0xe;
      if ((FILE *)s->img_file == (FILE *)0x0) {
        s->img_buffer = s->img_buffer + iVar10;
      }
      else {
        fseek((FILE *)s->img_file,(long)iVar10,1);
      }
      if (iVar7 == 4) {
        uVar14 = s->img_x + 1 >> 1;
      }
      else {
        if (iVar7 != 8) goto LAB_001c3662;
        uVar14 = s->img_x;
      }
      uVar5 = s->img_y;
      if (0 < (int)uVar5) {
        uVar21 = 0;
        iVar10 = 0;
        do {
          if (0 < (int)s->img_x) {
            iVar20 = 0;
            do {
              uVar15 = get8(s);
              uVar16 = uVar15 & 0xf;
              uVar23 = (int)uVar15 >> 4;
              if (iVar7 != 4) {
                uVar16 = 0;
                uVar23 = uVar15;
              }
              lVar17 = (long)(int)uVar21;
              uVar24 = lVar17 + 3;
              lVar19 = (long)(int)uVar23;
              data[lVar17] = auStack_438[lVar19 * 4];
              data[lVar17 + 1] = auStack_438[lVar19 * 4 + 1];
              data[lVar17 + 2] = auStack_438[lVar19 * 4 + 2];
              if (iVar4 == 4) {
                data[uVar24] = 0xff;
                uVar24 = (ulong)((int)uVar21 + 4);
              }
              if (iVar20 + 1U == s->img_x) {
                uVar21 = uVar24 & 0xffffffff;
                break;
              }
              if (iVar7 == 8) {
                uVar16 = get8(s);
              }
              lVar19 = (long)(int)uVar24;
              uVar21 = lVar19 + 3;
              lVar17 = (long)(int)uVar16;
              data[lVar19] = auStack_438[lVar17 * 4];
              data[lVar19 + 1] = auStack_438[lVar17 * 4 + 1];
              data[lVar19 + 2] = auStack_438[lVar17 * 4 + 2];
              if (iVar4 == 4) {
                data[uVar21] = 0xff;
                uVar21 = (ulong)((int)uVar24 + 4);
              }
              iVar20 = iVar20 + 2;
            } while (iVar20 < (int)s->img_x);
          }
          if ((FILE *)s->img_file == (FILE *)0x0) {
            s->img_buffer = s->img_buffer + (-uVar14 & 3);
          }
          else {
            fseek((FILE *)s->img_file,(ulong)(-uVar14 & 3),1);
          }
          iVar10 = iVar10 + 1;
          uVar5 = s->img_y;
        } while (iVar10 < (int)uVar5);
      }
      goto LAB_001c3d9c;
    }
LAB_001c3662:
    free(data);
    goto LAB_001c3c29;
  }
  iVar10 = (uVar5 - uVar6) + -0xe;
  if ((FILE *)s->img_file == (FILE *)0x0) {
    s->img_buffer = s->img_buffer + iVar10;
  }
  else {
    fseek((FILE *)s->img_file,(long)iVar10,1);
  }
  if (iVar7 == 0x20) {
    uVar21 = 0;
    if (uVar11 != 0xff000000 || (uVar23 != 0xff000000 || (local_4ac != 0xff00 || local_4a8 != 0xff))
       ) goto LAB_001c3932;
    bVar27 = true;
LAB_001c3906:
    bVar3 = false;
    local_484 = 0;
    local_48c = 0;
    iVar10 = 0;
    local_488 = 0;
    uVar14 = 0;
  }
  else {
    if (iVar7 == 0x18) {
      uVar21 = (ulong)(s->img_x & 3);
      bVar27 = false;
      goto LAB_001c3906;
    }
    uVar21 = 0;
    if (iVar7 == 0x10) {
      uVar21 = (ulong)(s->img_x * 2 & 2);
    }
LAB_001c3932:
    if ((local_4ac == 0 || uVar23 == 0) || local_4a8 == 0) {
LAB_001c3c29:
      failure_reason = "Corrupt BMP";
      return (stbi_uc *)0x0;
    }
    local_484 = high_bit(uVar23);
    local_484 = local_484 + -7;
    uVar14 = bitcount(uVar23);
    local_48c = high_bit(local_4ac);
    local_48c = local_48c + -7;
    iVar10 = high_bit(local_4a8);
    iVar10 = iVar10 + -7;
    local_488 = high_bit(uVar11);
    local_488 = local_488 + -7;
    bVar3 = true;
    bVar27 = false;
  }
  uVar5 = s->img_y;
  if (0 < (int)uVar5) {
    bVar1 = (byte)local_48c;
    bVar2 = (byte)iVar10;
    uVar24 = 0;
    iVar20 = 0;
    do {
      iVar25 = (int)uVar24;
      if (bVar3) {
        if (0 < (int)s->img_x) {
          iVar26 = 0;
          do {
            if (iVar7 == 0x10) {
              iVar12 = get8(s);
              iVar13 = get8(s);
              uVar15 = iVar13 * 0x100 + iVar12;
            }
            else {
              uVar15 = get32le(s);
            }
            iVar12 = (int)(uVar15 & uVar23) >> ((byte)local_484 & 0x1f);
            if (local_484 < 0) {
              iVar12 = (uVar15 & uVar23) << (-(byte)local_484 & 0x1f);
            }
            lVar17 = (long)iVar25;
            uVar16 = uVar14;
            iVar13 = iVar12;
            if (uVar14 < 8) {
              do {
                iVar13 = iVar13 + (iVar12 >> ((byte)uVar16 & 0x1f));
                uVar16 = uVar16 + uVar14;
              } while (uVar16 < 8);
              iVar12 = (int)(uVar15 & local_4ac) >> (bVar1 & 0x1f);
              if (local_48c < 0) {
                iVar12 = (uVar15 & local_4ac) << (-bVar1 & 0x1f);
              }
              data[lVar17] = (uchar)iVar13;
              uVar16 = uVar14;
              iVar13 = iVar12;
              if (7 < uVar14) goto LAB_001c3b01;
              do {
                iVar13 = iVar13 + (iVar12 >> ((byte)uVar16 & 0x1f));
                uVar16 = uVar16 + uVar14;
              } while (uVar16 < 8);
              iVar12 = (int)(uVar15 & local_4a8) >> (bVar2 & 0x1f);
              if (iVar10 < 0) {
                iVar12 = (uVar15 & local_4a8) << (-bVar2 & 0x1f);
              }
              data[lVar17 + 1] = (uchar)iVar13;
              iVar13 = iVar12;
              for (uVar16 = uVar14; uVar18 = (uchar)iVar13, uVar16 < 8; uVar16 = uVar16 + uVar14) {
                iVar13 = iVar13 + (iVar12 >> ((byte)uVar16 & 0x1f));
              }
            }
            else {
              data[lVar17] = (uchar)iVar12;
              iVar12 = (int)(uVar15 & local_4ac) >> (bVar1 & 0x1f);
              if (local_48c < 0) {
                iVar12 = (uVar15 & local_4ac) << (-bVar1 & 0x1f);
              }
LAB_001c3b01:
              data[lVar17 + 1] = (uchar)iVar12;
              uVar18 = (uchar)((int)(uVar15 & local_4a8) >> (bVar2 & 0x1f));
              if (iVar10 < 0) {
                uVar18 = (uchar)((uVar15 & local_4a8) << (-bVar2 & 0x1f));
              }
            }
            data[lVar17 + 2] = uVar18;
            if (uVar11 == 0) {
              uVar18 = 0xff;
            }
            else {
              iVar12 = (int)(uVar15 & uVar11) >> ((byte)local_488 & 0x1f);
              if (local_488 < 0) {
                iVar12 = (uVar15 & uVar11) << (-(byte)local_488 & 0x1f);
              }
              uVar15 = uVar14;
              iVar13 = iVar12;
              if (uVar14 < 8) {
                do {
                  iVar13 = iVar13 + (iVar12 >> ((byte)uVar15 & 0x1f));
                  uVar18 = (uchar)iVar13;
                  uVar15 = uVar15 + uVar14;
                } while (uVar15 < 8);
              }
              else {
                uVar18 = (uchar)iVar12;
              }
            }
            uVar24 = lVar17 + 3;
            if (iVar4 == 4) {
              data[uVar24] = uVar18;
              uVar24 = (ulong)(iVar25 + 4);
            }
            iVar26 = iVar26 + 1;
            iVar25 = (int)uVar24;
          } while (iVar26 < (int)s->img_x);
        }
      }
      else if (0 < (int)s->img_x) {
        iVar25 = 0;
        do {
          iVar26 = (int)uVar24;
          iVar12 = get8(s);
          lVar17 = (long)iVar26;
          data[lVar17 + 2] = (uchar)iVar12;
          iVar12 = get8(s);
          data[lVar17 + 1] = (uchar)iVar12;
          iVar12 = get8(s);
          data[lVar17] = (uchar)iVar12;
          uVar18 = 0xff;
          if (bVar27) {
            iVar12 = get8(s);
            uVar18 = (uchar)iVar12;
          }
          uVar24 = lVar17 + 3;
          if (iVar4 == 4) {
            data[uVar24] = uVar18;
            uVar24 = (ulong)(iVar26 + 4);
          }
          iVar25 = iVar25 + 1;
        } while (iVar25 < (int)s->img_x);
      }
      if ((FILE *)s->img_file == (FILE *)0x0) {
        s->img_buffer = s->img_buffer + uVar21;
      }
      else {
        fseek((FILE *)s->img_file,uVar21,1);
      }
      iVar20 = iVar20 + 1;
      uVar5 = s->img_y;
    } while (iVar20 < (int)uVar5);
  }
LAB_001c3d9c:
  if ((int)uVar8 < 1) {
    x_00 = s->img_x;
  }
  else {
    x_00 = s->img_x;
    if (0 < (int)uVar5 >> 1) {
      uVar14 = iVar4 * x_00;
      uVar23 = (uVar5 - 1) * uVar14;
      uVar21 = 0;
      uVar24 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar22 = 0;
          do {
            uVar18 = data[uVar22 + uVar21];
            data[uVar22 + uVar21] = data[uVar22 + uVar23];
            data[uVar22 + uVar23] = uVar18;
            uVar22 = uVar22 + 1;
          } while (uVar14 != uVar22);
        }
        uVar24 = uVar24 + 1;
        uVar23 = uVar23 - uVar14;
        uVar21 = (ulong)((int)uVar21 + uVar14);
      } while (uVar24 != (uint)((int)uVar5 >> 1));
    }
  }
  if ((req_comp != 0) && (iVar4 != req_comp)) {
    data = convert_format(data,iVar4,req_comp,x_00,uVar5);
    if (data == (uchar *)0x0) {
      return (stbi_uc *)0x0;
    }
    x_00 = s->img_x;
  }
  *x = x_00;
  *y = s->img_y;
  if (comp != (int *)0x0) {
    *comp = iVar4;
    return data;
  }
  return data;
}

Assistant:

static stbi_uc *bmp_load(stbi *s, int *x, int *y, int *comp, int req_comp)
{
   uint8 *out;
   unsigned int mr=0,mg=0,mb=0,ma=0;
   stbi_uc pal[256][4];
   int psize=0,i,j,compress=0,width;
   int bpp, flip_vertically, pad, target, offset, hsz;
   if (get8(s) != 'B' || get8(s) != 'M') return epuc("not BMP", "Corrupt BMP");
   get32le(s); // discard filesize
   get16le(s); // discard reserved
   get16le(s); // discard reserved
   offset = get32le(s);
   hsz = get32le(s);
   if (hsz != 12 && hsz != 40 && hsz != 56 && hsz != 108) return epuc("unknown BMP", "BMP type not supported: unknown");
   failure_reason = "bad BMP";
   if (hsz == 12) {
      s->img_x = get16le(s);
      s->img_y = get16le(s);
   } else {
      s->img_x = get32le(s);
      s->img_y = get32le(s);
   }
   if (get16le(s) != 1) return 0;
   bpp = get16le(s);
   if (bpp == 1) return epuc("monochrome", "BMP type not supported: 1-bit");
   flip_vertically = ((int) s->img_y) > 0;
   s->img_y = abs((int) s->img_y);
   if (hsz == 12) {
      if (bpp < 24)
         psize = (offset - 14 - 24) / 3;
   } else {
      compress = get32le(s);
      if (compress == 1 || compress == 2) return epuc("BMP RLE", "BMP type not supported: RLE");
      get32le(s); // discard sizeof
      get32le(s); // discard hres
      get32le(s); // discard vres
      get32le(s); // discard colorsused
      get32le(s); // discard max important
      if (hsz == 40 || hsz == 56) {
         if (hsz == 56) {
            get32le(s);
            get32le(s);
            get32le(s);
            get32le(s);
         }
         if (bpp == 16 || bpp == 32) {
            mr = mg = mb = 0;
            if (compress == 0) {
               if (bpp == 32) {
                  mr = 0xff << 16;
                  mg = 0xff <<  8;
                  mb = 0xff <<  0;
               } else {
                  mr = 31 << 10;
                  mg = 31 <<  5;
                  mb = 31 <<  0;
               }
            } else if (compress == 3) {
               mr = get32le(s);
               mg = get32le(s);
               mb = get32le(s);
               // not documented, but generated by photoshop and handled by mspaint
               if (mr == mg && mg == mb) {
                  // ?!?!?
                  return NULL;
               }
            } else
               return NULL;
         }
      } else {
         assert(hsz == 108);
         mr = get32le(s);
         mg = get32le(s);
         mb = get32le(s);
         ma = get32le(s);
         get32le(s); // discard color space
         for (i=0; i < 12; ++i)
            get32le(s); // discard color space parameters
      }
      if (bpp < 16)
         psize = (offset - 14 - hsz) >> 2;
   }
   s->img_n = ma ? 4 : 3;
   if (req_comp && req_comp >= 3) // we can directly decode 3 or 4
      target = req_comp;
   else
      target = s->img_n; // if they want monochrome, we'll post-convert
   out = (stbi_uc *) malloc(target * s->img_x * s->img_y);
   if (!out) return epuc("outofmem", "Out of memory");
   if (bpp < 16) {
      int z=0;
      if (psize == 0 || psize > 256) { free(out); return epuc("invalid", "Corrupt BMP"); }
      for (i=0; i < psize; ++i) {
         pal[i][2] = get8(s);
         pal[i][1] = get8(s);
         pal[i][0] = get8(s);
         if (hsz != 12) get8(s);
         pal[i][3] = 255;
      }
      skip(s, offset - 14 - hsz - psize * (hsz == 12 ? 3 : 4));
      if (bpp == 4) width = (s->img_x + 1) >> 1;
      else if (bpp == 8) width = s->img_x;
      else { free(out); return epuc("bad bpp", "Corrupt BMP"); }
      pad = (-width)&3;
      for (j=0; j < (int) s->img_y; ++j) {
         for (i=0; i < (int) s->img_x; i += 2) {
            int v=get8(s),v2=0;
            if (bpp == 4) {
               v2 = v & 15;
               v >>= 4;
            }
            out[z++] = pal[v][0];
            out[z++] = pal[v][1];
            out[z++] = pal[v][2];
            if (target == 4) out[z++] = 255;
            if (i+1 == (int) s->img_x) break;
            v = (bpp == 8) ? get8(s) : v2;
            out[z++] = pal[v][0];
            out[z++] = pal[v][1];
            out[z++] = pal[v][2];
            if (target == 4) out[z++] = 255;
         }
         skip(s, pad);
      }
   } else {
      int rshift=0,gshift=0,bshift=0,ashift=0,rcount=0,gcount=0,bcount=0,acount=0;
      int z = 0;
      int easy=0;
      skip(s, offset - 14 - hsz);
      if (bpp == 24) width = 3 * s->img_x;
      else if (bpp == 16) width = 2*s->img_x;
      else /* bpp = 32 and pad = 0 */ width=0;
      pad = (-width) & 3;
      if (bpp == 24) {
         easy = 1;
      } else if (bpp == 32) {
         if (mb == 0xff && mg == 0xff00 && mr == 0xff000000 && ma == 0xff000000)
            easy = 2;
      }
      if (!easy) {
         if (!mr || !mg || !mb) return epuc("bad masks", "Corrupt BMP");
         // right shift amt to put high bit in position #7
         rshift = high_bit(mr)-7; rcount = bitcount(mr);
         gshift = high_bit(mg)-7; gcount = bitcount(mr);
         bshift = high_bit(mb)-7; bcount = bitcount(mr);
         ashift = high_bit(ma)-7; acount = bitcount(mr);
      }
      for (j=0; j < (int) s->img_y; ++j) {
         if (easy) {
            for (i=0; i < (int) s->img_x; ++i) {
               int a;
               out[z+2] = get8(s);
               out[z+1] = get8(s);
               out[z+0] = get8(s);
               z += 3;
               a = (easy == 2 ? get8(s) : 255);
               if (target == 4) out[z++] = a;
            }
         } else {
            for (i=0; i < (int) s->img_x; ++i) {
               uint32 v = (bpp == 16 ? get16le(s) : get32le(s));
               int a;
               out[z++] = shiftsigned(v & mr, rshift, rcount);
               out[z++] = shiftsigned(v & mg, gshift, gcount);
               out[z++] = shiftsigned(v & mb, bshift, bcount);
               a = (ma ? shiftsigned(v & ma, ashift, acount) : 255);
               if (target == 4) out[z++] = a;
            }
         }
         skip(s, pad);
      }
   }
   if (flip_vertically) {
      stbi_uc t;
      for (j=0; j < (int) s->img_y>>1; ++j) {
         stbi_uc *p1 = out +      j     *s->img_x*target;
         stbi_uc *p2 = out + (s->img_y-1-j)*s->img_x*target;
         for (i=0; i < (int) s->img_x*target; ++i) {
            t = p1[i], p1[i] = p2[i], p2[i] = t;
         }
      }
   }

   if (req_comp && req_comp != target) {
      out = convert_format(out, target, req_comp, s->img_x, s->img_y);
      if (out == NULL) return out; // convert_format frees input on failure
   }

   *x = s->img_x;
   *y = s->img_y;
   if (comp) *comp = target;
   return out;
}